

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MarkAlgConDeleted
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int con_index)

{
  size_type sVar1;
  int in_ESI;
  long in_RDI;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  bool in_stack_00000067;
  size_type in_stack_00000068;
  vector<bool,_std::allocator<bool>_> *in_stack_00000070;
  size_t in_stack_ffffffffffffffc8;
  _Bit_type *local_20;
  _Bit_type *__n;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  iVar2 = in_ESI;
  __n = local_20;
  std::
  vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
  ::size((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
          *)(in_RDI + 0x228));
  internal::CheckIndex(in_ESI,in_stack_ffffffffffffffc8);
  sVar1 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
  if (sVar1 <= (ulong)(long)iVar2) {
    num_algebraic_cons((BasicProblem<mp::BasicProblemParams<int>_> *)0x19f1c9);
    std::vector<bool,_std::allocator<bool>_>::resize
              (in_stack_00000070,in_stack_00000068,in_stack_00000067);
  }
  _local_20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT44(iVar2,in_stack_fffffffffffffff0),(size_type)__n);
  std::_Bit_reference::operator=((_Bit_reference *)&local_20,true);
  return;
}

Assistant:

void MarkAlgConDeleted(int con_index) {
    internal::CheckIndex(con_index, algebraic_cons_.size());
    if (is_alg_con_deleted_.size() <= static_cast<std::size_t>(con_index))
      is_alg_con_deleted_.resize(num_algebraic_cons());
    is_alg_con_deleted_[con_index] = true;
  }